

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

string * anon_unknown.dwarf_216a9::getJSONForURI(string *uri)

{
  bool bVar1;
  string *in_RDI;
  string responseString;
  char *in_stack_ffffffffffffff98;
  string *__lhs;
  allocator<char> local_3d [13];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  __lhs = in_RDI;
  getJSONForURI_impl(in_RDI);
  bVar1 = std::operator==(__lhs,in_stack_ffffffffffffff98);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator(local_3d);
  }
  else {
    std::__cxx11::string::string((string *)__lhs,(string *)&stack0xffffffffffffffd0);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string getJSONForURI(const std::string & uri) {
        auto responseString = getJSONForURI_impl(uri);
        if (responseString == "") return "";

        return responseString;
    }